

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# profit.c
# Opt level: O0

int prf_interface_supported(int version,int revision)

{
  int revision_local;
  int version_local;
  undefined4 local_4;
  
  if ((version == 0) && (revision < 1)) {
    local_4 = 1;
  }
  else if ((version < 0) && (-1 < version)) {
    local_4 = 1;
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int
prf_interface_supported(
    int version,
    int revision )
{
    if ( (version == PROFIT_INTERFACE_VERSION) &&
         (revision <= PROFIT_INTERFACE_REVISION) )
        return TRUE;
    if ( (version < PROFIT_INTERFACE_VERSION) &&
         (version >= (PROFIT_INTERFACE_VERSION - PROFIT_INTERFACE_AGE)) )
        return TRUE;
    return FALSE;
}